

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O3

BOOL VIRTUALInitialize(void)

{
  if (PAL_InitializeChakraCoreCalled) {
    InternalInitializeCriticalSection(&virtual_critsec);
    pVirtualMemory = (PCMI)0x0;
    pVirtualMemoryLastFound = (PCMI)0x0;
    return 1;
  }
  abort();
}

Assistant:

BOOL
VIRTUALInitialize( void )
{
    TRACE( "Initializing the Virtual Critical Sections. \n" );

    InternalInitializeCriticalSection(&virtual_critsec);

    pVirtualMemory = NULL;
    pVirtualMemoryLastFound = NULL;

    return TRUE;
}